

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

t_pool * t_pool_init(int qsize,int tsize)

{
  int iVar1;
  t_pool_worker_t *ptVar2;
  int *piVar3;
  t_pool_worker_t *w;
  t_pool *p;
  int i;
  int tsize_local;
  int qsize_local;
  
  _tsize_local = (t_pool *)malloc(0x108);
  _tsize_local->qsize = qsize;
  _tsize_local->tsize = tsize;
  _tsize_local->njobs = 0;
  _tsize_local->nwaiting = 0;
  _tsize_local->shutdown = 0;
  _tsize_local->tail = (t_pool_job *)0x0;
  _tsize_local->head = (t_pool_job *)0x0;
  _tsize_local->t_stack = (int *)0x0;
  ptVar2 = (t_pool_worker_t *)malloc((long)tsize * 0x50);
  _tsize_local->t = ptVar2;
  pthread_mutex_init((pthread_mutex_t *)&_tsize_local->pool_m,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&_tsize_local->empty_c,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&_tsize_local->full_c,(pthread_condattr_t *)0x0);
  pthread_mutex_lock((pthread_mutex_t *)&_tsize_local->pool_m);
  piVar3 = (int *)malloc((long)tsize << 2);
  _tsize_local->t_stack = piVar3;
  if (piVar3 == (int *)0x0) {
    _tsize_local = (t_pool *)0x0;
  }
  else {
    _tsize_local->t_stack_top = -1;
    for (p._4_4_ = 0; p._4_4_ < tsize; p._4_4_ = p._4_4_ + 1) {
      ptVar2 = _tsize_local->t + p._4_4_;
      _tsize_local->t_stack[p._4_4_] = 0;
      ptVar2->p = _tsize_local;
      ptVar2->idx = p._4_4_;
      ptVar2->wait_time = 0;
      pthread_cond_init((pthread_cond_t *)&ptVar2->pending_c,(pthread_condattr_t *)0x0);
      iVar1 = pthread_create(&ptVar2->tid,(pthread_attr_t *)0x0,t_pool_worker,ptVar2);
      if (iVar1 != 0) {
        return (t_pool *)0x0;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&_tsize_local->pool_m);
  }
  return _tsize_local;
}

Assistant:

t_pool *t_pool_init(int qsize, int tsize) {
    int i;
    t_pool *p = malloc(sizeof(*p));
    p->qsize = qsize;
    p->tsize = tsize;
    p->njobs = 0;
    p->nwaiting = 0;
    p->shutdown = 0;
    p->head = p->tail = NULL;
    p->t_stack = NULL;
#ifdef DEBUG_TIME
    p->total_time = p->wait_time = 0;
#endif

    p->t = malloc(tsize * sizeof(p->t[0]));

    pthread_mutex_init(&p->pool_m, NULL);
    pthread_cond_init(&p->empty_c, NULL);
    pthread_cond_init(&p->full_c, NULL);

    pthread_mutex_lock(&p->pool_m);

#ifdef IN_ORDER
    if (!(p->t_stack = malloc(tsize * sizeof(*p->t_stack))))
	return NULL;
    p->t_stack_top = -1;

    for (i = 0; i < tsize; i++) {
	t_pool_worker_t *w = &p->t[i];
	p->t_stack[i] = 0;
	w->p = p;
	w->idx = i;
	w->wait_time = 0;
	pthread_cond_init(&w->pending_c, NULL);
	if (0 != pthread_create(&w->tid, NULL, t_pool_worker, w))
	    return NULL;
    }
#else
    pthread_cond_init(&p->pending_c, NULL);

    for (i = 0; i < tsize; i++) {
	t_pool_worker_t *w = &p->t[i];
	w->p = p;
	w->idx = i;
	pthread_cond_init(&w->pending_c, NULL);
	if (0 != pthread_create(&w->tid, NULL, t_pool_worker, w))
	    return NULL;
    }
#endif

    pthread_mutex_unlock(&p->pool_m);

    return p;
}